

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  int iVar1;
  char *z_00;
  undefined8 in_RDX;
  Fts5Colset *in_RSI;
  Fts5Parse *in_RDI;
  Fts5Config *pConfig;
  char *z;
  int iCol;
  Fts5Colset *pRet;
  Fts5Config *zLeft;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  Fts5Colset *pFVar3;
  int iCol_00;
  
  pFVar3 = (Fts5Colset *)0x0;
  z_00 = sqlite3Fts5Strndup((int *)0x0,(char *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd8),
                            -0x55555556);
  if (in_RDI->rc == 0) {
    zLeft = in_RDI->pConfig;
    sqlite3Fts5Dequote(z_00);
    for (iVar2 = 0; iCol_00 = (int)((ulong)in_RDX >> 0x20), iVar2 < zLeft->nCol; iVar2 = iVar2 + 1)
    {
      iVar1 = sqlite3_stricmp((char *)zLeft,(char *)0x26e04b);
      iCol_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar1 == 0) break;
    }
    if (iVar2 == zLeft->nCol) {
      sqlite3Fts5ParseError(in_RDI,"no such column: %s",z_00);
    }
    else {
      pFVar3 = fts5ParseColset(in_RDI,in_RSI,iCol_00);
    }
    sqlite3_free((void *)0x26e0ad);
  }
  if (pFVar3 == (Fts5Colset *)0x0) {
    sqlite3_free((void *)0x26e0bf);
  }
  return pFVar3;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}